

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.h
# Opt level: O0

void __thiscall Net::Conv(Net *this)

{
  DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *other;
  DenseCoeffsBase<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_1> *this_00;
  Scalar *pSVar1;
  Scalar SVar2;
  NestedExpressionType local_d8;
  NestedExpressionType local_d0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
  local_c8;
  BlockXpr local_b0;
  int local_74;
  int local_70;
  int j;
  int i;
  int k;
  MatrixXf cur3;
  undefined1 local_40 [8];
  MatrixXf cur2;
  MatrixXf cur1;
  Net *this_local;
  
  Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<float,__1,__1,_0,__1,__1> *)
             &cur2.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
  ;
  Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_40);
  Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<float,__1,__1,_0,__1,__1> *)&i);
  for (j = 0; j < 8; j = j + 1) {
    other = (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
            Eigen::
            DenseCoeffsBase<Eigen::Matrix<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_8,_1,_0,_8,_1>,_1>::
            operator()((DenseCoeffsBase<Eigen::Matrix<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_8,_1,_0,_8,_1>,_1>
                        *)&this->convKernel,(long)j,0);
    Eigen::Matrix<float,-1,-1,0,-1,-1>::operator=((Matrix<float,_1,_1,0,_1,_1> *)local_40,other);
    for (local_70 = 0; local_70 < 0x2e; local_70 = local_70 + 1) {
      for (local_74 = 0; local_74 < 0x16; local_74 = local_74 + 1) {
        Eigen::DenseBase<Eigen::Matrix<float,_50,_26,_0,_50,_26>_>::block
                  (&local_b0,(DenseBase<Eigen::Matrix<float,_50,_26,_0,_50,_26>_> *)&this->pad,
                   (long)local_70,(long)local_74,3,3);
        Eigen::Matrix<float,-1,-1,0,-1,-1>::operator=
                  ((Matrix<float,_1,_1,0,_1,_1> *)
                   &cur2.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols,(DenseBase<Eigen::Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false>_>
                            *)&local_b0);
        local_d0 = (NestedExpressionType)
                   Eigen::MatrixBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::array
                             ((MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)
                              &cur2.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                               m_storage.m_cols);
        local_d8 = (NestedExpressionType)
                   Eigen::MatrixBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::array
                             ((MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_40);
        Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<float,-1,-1,0,-1,-1>>>::operator*
                  (&local_c8,
                   (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<float,_1,_1,0,_1,_1>>> *)&local_d0,
                   (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_> *)
                   &local_d8);
        Eigen::Matrix<float,-1,-1,0,-1,-1>::operator=
                  ((Matrix<float,_1,_1,0,_1,_1> *)&i,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
                    *)&local_c8);
        SVar2 = Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::sum
                          ((DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&i);
        this_00 = (DenseCoeffsBase<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_1> *)
                  Eigen::
                  DenseCoeffsBase<Eigen::Matrix<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_8,_1,_0,_8,_1>,_1>
                  ::operator()((DenseCoeffsBase<Eigen::Matrix<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_8,_1,_0,_8,_1>,_1>
                                *)&this->convData,(long)j,0);
        pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_1>::operator()
                           (this_00,(long)local_70,(long)local_74);
        *pSVar1 = SVar2;
      }
    }
  }
  Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)&i);
  Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_40);
  Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<float,__1,__1,_0,__1,__1> *)
             &cur2.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
  ;
  return;
}

Assistant:

void Net::Conv()
{
    MatrixXf cur1,cur2,cur3;

    for(int k = 0 ;k < CONV_CHANNEL; k++)
    {
        cur2 = convKernel(k,0);
        for(int i = 0; i <= BLOCK_HEIGHT - CONVKS; i++)
        {
            for(int j = 0; j <= BLOCK_WIDTH  - CONVKS; j++)
            {
                if(i < 0 || j < 0)
                    assert("Conv Error!");
                cur1 = pad.block(i,j,CONVKS,CONVKS);
                cur3 = cur1.array()*cur2.array();
                //FUCK YOU EIGEN
                (convData(k,0))(i,j) = cur3.sum();

                //To-Do::Added offset activation function

            }
        }
    }
}